

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O1

int sptk::world::anon_unknown_5::ExtendF0
              (double *f0,int f0_length,int origin,int last_point,int shift,double **f0_candidates,
              int number_of_candidates,double allowed_range,double *extended_f0)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  double *pdVar18;
  double dVar19;
  int iVar21;
  double dVar20;
  double *pdVar22;
  long lVar17;
  
  uVar7 = (ulong)f0 & 0xffffffff;
  pdVar22 = f0_candidates[(int)f0];
  uVar8 = f0_length - (int)f0;
  uVar3 = -uVar8;
  if (0 < (int)uVar8) {
    uVar3 = uVar8;
  }
  pvVar6 = operator_new__((ulong)uVar3 * 4 + 4);
  auVar5 = _DAT_0012bcc0;
  auVar14._4_4_ = 0;
  auVar14._0_4_ = uVar3;
  auVar14._8_4_ = uVar3;
  auVar14._12_4_ = 0;
  lVar9 = 0;
  auVar14 = auVar14 ^ _DAT_0012bcc0;
  uVar10 = (ulong)f0 & 0xffffffff;
  auVar16 = _DAT_0012bcb0;
  do {
    bVar2 = auVar14._0_4_ < SUB164(auVar16 ^ auVar5,0);
    iVar15 = auVar14._4_4_;
    iVar21 = SUB164(auVar16 ^ auVar5,4);
    iVar11 = (int)uVar10;
    if ((bool)(~(iVar15 < iVar21 || iVar21 == iVar15 && bVar2) & 1)) {
      *(int *)((long)pvVar6 + lVar9) = iVar11;
    }
    if (iVar15 >= iVar21 && (iVar21 != iVar15 || !bVar2)) {
      *(int *)((long)pvVar6 + lVar9 + 4) = origin + iVar11;
    }
    lVar17 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 2;
    auVar16._8_8_ = lVar17 + 2;
    lVar9 = lVar9 + 8;
    uVar10 = (ulong)(uint)(iVar11 + origin * 2);
  } while ((ulong)(uVar3 >> 1 & 0x3fffffff) * 8 + 8 != lVar9);
  uVar10 = 0;
  iVar11 = 0;
  do {
    uVar12 = (long)*(int *)((long)pvVar6 + uVar10 * 4) + (long)origin;
    pdVar18 = (double *)0x0;
    if (0 < shift) {
      uVar13 = 0;
      dVar19 = allowed_range;
      do {
        dVar1 = *(double *)
                 (*(long *)(CONCAT44(in_register_0000000c,last_point) + uVar12 * 8) + uVar13 * 8);
        dVar20 = ABS((double)pdVar22 - dVar1) / (double)pdVar22;
        dVar4 = dVar19;
        if (dVar20 <= dVar19) {
          dVar4 = dVar20;
        }
        pdVar18 = (double *)
                  (-(ulong)(dVar19 < dVar20) & (ulong)pdVar18 |
                  ~-(ulong)(dVar19 < dVar20) & (ulong)dVar1);
        uVar13 = uVar13 + 1;
        dVar19 = dVar4;
      } while ((uint)shift != uVar13);
    }
    iVar11 = iVar11 + 1;
    if ((double)pdVar18 != 0.0) {
      uVar7 = uVar12 & 0xffffffff;
    }
    if (NAN((double)pdVar18)) {
      uVar7 = uVar12 & 0xffffffff;
    }
    if ((double)pdVar18 != 0.0) {
      iVar11 = 0;
    }
    f0_candidates[uVar12] = pdVar18;
    if (NAN((double)pdVar18)) {
      iVar11 = 0;
    }
    if (iVar11 == 4) break;
    pdVar22 = (double *)
              ((ulong)pdVar22 & -(ulong)((double)pdVar18 == 0.0) |
              ~-(ulong)((double)pdVar18 == 0.0) & (ulong)pdVar18);
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar3 + 1);
  operator_delete__(pvVar6);
  return (int)uVar7;
}

Assistant:

static int ExtendF0(const double *f0, int f0_length, int origin,
    int last_point, int shift, const double * const *f0_candidates,
    int number_of_candidates, double allowed_range, double *extended_f0) {
  int threshold = 4;
  double tmp_f0 = extended_f0[origin];
  int shifted_origin = origin;

  int distance = MyAbsInt(last_point - origin);
  int *index_list = new int[distance + 1];
  for (int i = 0; i <= distance; ++i) index_list[i] = origin + shift * i;

  int count = 0;
  double dammy;
  for (int i = 0; i <= distance; ++i) {
    extended_f0[index_list[i] + shift] =
      SelectBestF0(tmp_f0, f0_candidates[index_list[i] + shift],
      number_of_candidates, allowed_range, &dammy);
    if (extended_f0[index_list[i] + shift] == 0.0) {
      count++;
    } else {
      tmp_f0 = extended_f0[index_list[i] + shift];
      count = 0;
      shifted_origin = index_list[i] + shift;
    }
    if (count == threshold) break;
  }

  delete[] index_list;
  return shifted_origin;
}